

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> __thiscall
Test::Suite::runTestMethod(Suite *this,TestMethod *method)

{
  string *this_00;
  string *__str;
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  duration<long,_std::ratio<1L,_1000000L>_> dVar5;
  undefined8 uVar6;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> pVar7;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  this_00 = &this->currentTestMethodName;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&method->name);
  __str = &method->argString;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->currentTestMethodArgs,__str);
  this->currentTestSucceeded = true;
  (*this->output->_vptr_Output[4])(this->output,&this->suiteName,method,__str);
  iVar1 = (*this->_vptr_Suite[7])(this,this_00);
  if ((char)iVar1 == '\0') {
    uVar6 = 0;
    dVar5.__r = 0;
  }
  else {
    lVar3 = std::chrono::_V2::steady_clock::now();
    std::function<void_(Test::Suite_*)>::operator()(&method->functor,this);
    lVar4 = std::chrono::_V2::steady_clock::now();
    (*this->_vptr_Suite[8])(this,this_00,(ulong)this->currentTestSucceeded);
    (*this->output->_vptr_Output[5])
              (this->output,&this->suiteName,method,__str,(ulong)this->currentTestSucceeded);
    dVar5.__r = (lVar4 - lVar3) / 1000;
    uVar6 = CONCAT71((int7)((ulong)dVar5.__r >> 8),this->currentTestSucceeded);
  }
  pVar7.second.__r = dVar5.__r;
  pVar7._0_8_ = uVar6;
  return pVar7;
}

Assistant:

std::pair<bool, std::chrono::microseconds> Suite::runTestMethod(const TestMethod &method) {
  errno = 0;
  bool exceptionThrown = false;
  currentTestMethodName = method.name;
  currentTestMethodArgs = method.argString;
  currentTestSucceeded = true;
  output->initializeTestMethod(suiteName, method.name, method.argString);
  // run before() before every test
  if (before(currentTestMethodName)) {
    std::chrono::steady_clock::time_point startTime = std::chrono::steady_clock::now();
    try {
      method(static_cast<Suite *>(this));
    } catch (const AssertionFailedException &) {
      currentTestSucceeded = false;
    } catch (const std::exception &e) {
      exceptionThrown = true;
      currentTestSucceeded = false;
      output->printException(suiteName, method.name, method.argString, e);
    } catch (...) {
      exceptionThrown = true;
      currentTestSucceeded = false;
      output->printException(suiteName, method.name, method.argString, std::runtime_error("non-exception type thrown"));
    }
    std::chrono::steady_clock::time_point endTime = std::chrono::steady_clock::now();
    // run after() after every test
    after(currentTestMethodName, currentTestSucceeded);
    if (!exceptionThrown) {
      // we don't need to print twice, that the method has failed
      output->finishTestMethod(suiteName, method.name, method.argString, currentTestSucceeded);
    }
    return std::make_pair(
        currentTestSucceeded, std::chrono::duration_cast<std::chrono::microseconds>(endTime - startTime));
  }
  return std::make_pair(false, std::chrono::microseconds::zero());
}